

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_to_mask(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 arg1;
  
  tcg_ctx = s->uc->tcg_ctx;
  arg1 = gen_ea_mode(env,s,insn >> 3 & 7,insn & 7,2,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADU,
                     (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (arg1 != tcg_ctx->NULL_QREG) {
    tcg_gen_ori_i32_m68k(tcg_ctx,QREG_MAC_MASK,arg1,-0x10000);
    return;
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(to_mask)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv val;
    SRC_EA(env, val, OS_LONG, 0, NULL);
    tcg_gen_ori_i32(tcg_ctx, QREG_MAC_MASK, val, 0xffff0000);
}